

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match.cc
# Opt level: O2

bool bssl::anon_unknown_1::NormalizeValue
               (X509NameAttribute attribute,string *output,CertErrors *errors)

{
  bool bVar1;
  pointer *__ptr;
  CharsetEnforcement charset_enforcement;
  unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> local_28;
  CertErrorParams *local_20;
  
  if (errors == (CertErrors *)0x0) {
    abort();
  }
  bVar1 = X509NameAttribute::ValueAsStringUnsafe(&attribute,output);
  if (!bVar1) {
    CreateCertErrorParams1SizeT((bssl *)&local_20,"tag",(ulong)attribute.value_tag);
    CertErrors::AddError
              (errors,"Failed converting AttributeValue to string",
               (unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> *)
               &local_20);
    local_28._M_t.
    super___uniq_ptr_impl<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>._M_t.
    super__Tuple_impl<0UL,_bssl::CertErrorParams_*,_std::default_delete<bssl::CertErrorParams>_>.
    super__Head_base<0UL,_bssl::CertErrorParams_*,_false>._M_head_impl =
         (__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
          )(__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
            )local_20;
    goto LAB_0038d22b;
  }
  if ((ulong)attribute.value_tag == 0xc) {
LAB_0038d1b7:
    charset_enforcement = NO_ENFORCEMENT;
LAB_0038d1ef:
    bVar1 = NormalizeDirectoryString(charset_enforcement,output);
    if (bVar1) {
      return true;
    }
  }
  else {
    if (attribute.value_tag == 0x13) {
      charset_enforcement = ENFORCE_PRINTABLE_STRING;
      goto LAB_0038d1ef;
    }
    if (attribute.value_tag == 0x16) {
      charset_enforcement = ENFORCE_ASCII;
      goto LAB_0038d1ef;
    }
    if ((attribute.value_tag == 0x1e) || (attribute.value_tag == 0x1c)) goto LAB_0038d1b7;
  }
  CreateCertErrorParams1SizeT((bssl *)&local_28,"tag",(ulong)attribute.value_tag);
  CertErrors::AddError(errors,"Failed normalizing string",&local_28);
LAB_0038d22b:
  if (local_28._M_t.
      super___uniq_ptr_impl<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>._M_t
      .super__Tuple_impl<0UL,_bssl::CertErrorParams_*,_std::default_delete<bssl::CertErrorParams>_>.
      super__Head_base<0UL,_bssl::CertErrorParams_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>)0x0) {
    (*((CertErrorParams *)
      local_28._M_t.
      super___uniq_ptr_impl<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>._M_t
      .super__Tuple_impl<0UL,_bssl::CertErrorParams_*,_std::default_delete<bssl::CertErrorParams>_>.
      super__Head_base<0UL,_bssl::CertErrorParams_*,_false>._M_head_impl)->_vptr_CertErrorParams[1])
              ();
  }
  return false;
}

Assistant:

[[nodiscard]] bool NormalizeValue(X509NameAttribute attribute,
                                  std::string *output, CertErrors *errors) {
  BSSL_CHECK(errors);

  if (!attribute.ValueAsStringUnsafe(output)) {
    errors->AddError(kFailedConvertingAttributeValue,
                     CreateCertErrorParams1SizeT("tag", attribute.value_tag));
    return false;
  }

  bool success = false;
  switch (attribute.value_tag) {
    case CBS_ASN1_PRINTABLESTRING:
      success = NormalizeDirectoryString(ENFORCE_PRINTABLE_STRING, output);
      break;
    case CBS_ASN1_BMPSTRING:
    case CBS_ASN1_UNIVERSALSTRING:
    case CBS_ASN1_UTF8STRING:
      success = NormalizeDirectoryString(NO_ENFORCEMENT, output);
      break;
    case CBS_ASN1_IA5STRING:
      success = NormalizeDirectoryString(ENFORCE_ASCII, output);
      break;
    default:
      // NOTREACHED
      success = false;
      break;
  }

  if (!success) {
    errors->AddError(kFailedNormalizingString,
                     CreateCertErrorParams1SizeT("tag", attribute.value_tag));
  }

  return success;
}